

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::Clara::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  pointer pAVar1;
  ulong uVar2;
  ParserBase *pPVar3;
  pointer pPVar4;
  int iVar5;
  pointer pPVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t __n;
  Opt *opt;
  pointer pOVar7;
  pointer pAVar8;
  size_type in_R9;
  _Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *this_00;
  pointer pOVar9;
  pointer pPVar10;
  StringRef lhs;
  StringRef rhs;
  vector<ParserInfo,_std::allocator<ParserInfo>_> parseInfos;
  BasicResult<Catch::Clara::Detail::ParseState> result;
  Iterator local_118;
  Iterator IStack_110;
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_108;
  undefined1 local_e8 [16];
  undefined1 auStack_d8 [80];
  ParserResult local_88;
  StringRef *local_58;
  StringRef *pSStack_50;
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_48;
  
  parseInfos.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parseInfos.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parseInfos.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar7 = (this->m_options).
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar9 = (this->m_options).
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = (_Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *)
            (((long)(this->m_args).
                    super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_args).
                    super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 6) +
            ((long)pOVar9 - (long)pOVar7) / 0x58);
  if ((ulong)this_00 >> 0x3b != 0) {
    std::__throw_length_error("vector::reserve");
  }
  if (this_00 != (_Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *)0x0) {
    pPVar6 = std::_Vector_base<ParserInfo,_std::allocator<ParserInfo>_>::_M_allocate
                       (this_00,(size_t)this);
    std::_Vector_base<ParserInfo,_std::allocator<ParserInfo>_>::_M_deallocate
              ((_Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *)0x0,(pointer)0x0,__n);
    parseInfos.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pPVar6 + (long)this_00;
    pOVar7 = (this->m_options).
             super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
             super__Vector_impl_data._M_start;
    pOVar9 = (this->m_options).
             super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
             super__Vector_impl_data._M_finish;
    parseInfos.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar6;
  }
  parseInfos.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       parseInfos.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  for (; pOVar7 != pOVar9; pOVar7 = pOVar7 + 1) {
    result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.m_type = Ok;
    result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase._12_4_ = 0;
    result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase._vptr_ResultBase
         = (_func_int **)pOVar7;
    std::vector<ParserInfo,_std::allocator<ParserInfo>_>::push_back
              (&parseInfos,(value_type *)&result);
  }
  pAVar1 = (this->m_args).super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pAVar8 = (this->m_args).
                super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
                super__Vector_impl_data._M_start; pAVar8 != pAVar1; pAVar8 = pAVar8 + 1) {
    result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.m_type = Ok;
    result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase._12_4_ = 0;
    result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase._vptr_ResultBase
         = (_func_int **)pAVar8;
    std::vector<ParserInfo,_std::allocator<ParserInfo>_>::push_back
              (&parseInfos,(value_type *)&result);
  }
  ExeName::set(&local_88,&this->m_exeName,exeName);
  Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&local_88);
  local_58 = (tokens->it)._M_current;
  pSStack_50 = (tokens->itEnd)._M_current;
  auStack_d8._24_8_ =
       (tokens->m_tokenBuffer).
       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  auStack_d8._8_8_ =
       (tokens->m_tokenBuffer).
       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auStack_d8._16_8_ =
       (tokens->m_tokenBuffer).
       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._0_4_ = NoMatch;
  local_e8._8_8_ = (tokens->it)._M_current;
  auStack_d8._0_8_ = (tokens->itEnd)._M_current;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
            (&result,(ParseState *)local_e8);
  std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
  ~_Vector_base((_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 *)(auStack_d8 + 8));
  std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
  ~_Vector_base(&local_48);
  pPVar4 = parseInfos.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar6 = parseInfos.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    (*result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.
      _vptr_ResultBase[2])(&result);
    pPVar10 = pPVar6;
    if ((result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
         m_remainingTokens.m_tokenBuffer.
         super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
         m_remainingTokens.m_tokenBuffer.
         super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
        m_remainingTokens.it._M_current ==
        result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
        m_remainingTokens.itEnd._M_current)) {
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
                (__return_storage_ptr__,&result);
      goto LAB_0013a3a3;
    }
    for (; pPVar10 != pPVar4; pPVar10 = pPVar10 + 1) {
      iVar5 = (*pPVar10->parser->_vptr_ParserBase[4])();
      if ((CONCAT44(extraout_var,iVar5) == 0) ||
         (uVar2 = pPVar10->count, iVar5 = (*pPVar10->parser->_vptr_ParserBase[4])(),
         uVar2 < CONCAT44(extraout_var_00,iVar5))) {
        pPVar3 = pPVar10->parser;
        (*result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.
          _vptr_ResultBase[2])(&result);
        local_118._M_current =
             (StringRef *)
             result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
             m_remainingTokens.it._M_current;
        IStack_110._M_current =
             (StringRef *)
             result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
             m_remainingTokens.itEnd._M_current;
        local_108._M_impl.super__Vector_impl_data._M_start =
             result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
             m_remainingTokens.m_tokenBuffer.
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_108._M_impl.super__Vector_impl_data._M_finish =
             result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
             m_remainingTokens.m_tokenBuffer.
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_108._M_impl.super__Vector_impl_data._M_end_of_storage =
             result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
             m_remainingTokens.m_tokenBuffer.
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
        m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
        m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
        m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (*pPVar3->_vptr_ParserBase[3])
                  ((BasicResult<Catch::Clara::Detail::ParseState> *)local_e8,pPVar3,exeName,
                   &local_118);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::operator=
                  (&result,(BasicResult<Catch::Clara::Detail::ParseState> *)local_e8);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult
                  ((BasicResult<Catch::Clara::Detail::ParseState> *)local_e8);
        std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ::~_Vector_base(&local_108);
        if (result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.m_type
            != Ok) {
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
                    (__return_storage_ptr__,&result);
          goto LAB_0013a3a3;
        }
        (*result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.
          _vptr_ResultBase[2])(&result);
        if (result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.m_type !=
            NoMatch) {
          pPVar10->count = pPVar10->count + 1;
          break;
        }
      }
    }
    (*result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.
      _vptr_ResultBase[2])(&result);
    if (result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.m_type ==
        ShortCircuitAll) {
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
                (__return_storage_ptr__,&result);
      goto LAB_0013a3a3;
    }
  } while (pPVar10 != pPVar4);
  (*result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase._vptr_ResultBase
    [2])();
  lhs.m_size = (size_type)
               ((result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
                 m_remainingTokens.m_tokenBuffer.
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_start)->token).m_start;
  lhs.m_start = (char *)0x14;
  rhs.m_size = in_R9;
  rhs.m_start = (char *)((result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.
                          m_value.m_remainingTokens.m_tokenBuffer.
                          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                          ._M_impl.super__Vector_impl_data._M_start)->token).m_size;
  operator+[abi_cxx11_((string *)local_e8,(Catch *)"Unrecognised token: ",lhs,rhs);
  Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError
            (__return_storage_ptr__,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
LAB_0013a3a3:
  Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult(&result);
  std::vector<ParserInfo,_std::allocator<ParserInfo>_>::~vector(&parseInfos);
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult
        Parser::parse( std::string const& exeName,
                       Detail::TokenStream tokens ) const {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            std::vector<ParserInfo> parseInfos;
            parseInfos.reserve( m_options.size() + m_args.size() );
            for ( auto const& opt : m_options ) {
                parseInfos.push_back( { &opt, 0 } );
            }
            for ( auto const& arg : m_args ) {
                parseInfos.push_back( { &arg, 0 } );
            }

            m_exeName.set( exeName );

            auto result = Detail::InternalParseResult::ok(
                Detail::ParseState( ParseResultType::NoMatch, CATCH_MOVE(tokens) ) );
            while ( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for ( auto& parseInfo : parseInfos ) {
                    if ( parseInfo.parser->cardinality() == 0 ||
                         parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(
                            exeName, CATCH_MOVE(result).value().remainingTokens() );
                        if ( !result )
                            return result;
                        if ( result.value().type() !=
                             ParseResultType::NoMatch ) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if ( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if ( !tokenParsed )
                    return Detail::InternalParseResult::runtimeError(
                        "Unrecognised token: " +
                        result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }